

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O0

char * __thiscall CNscContext::GetTypeName(CNscContext *this,NscType nType)

{
  NscSymbol *pNVar1;
  int in_ESI;
  NscSymbol *pSymbol;
  CNscContext *in_stack_ffffffffffffffe0;
  char *local_8;
  
  switch(in_ESI) {
  case 0:
    local_8 = "[unknown]";
    break;
  case 1:
    local_8 = "void";
    break;
  case 2:
    local_8 = "[error]";
    break;
  case 3:
    local_8 = "action";
    break;
  case 4:
    local_8 = "[statement]";
    break;
  case 5:
    local_8 = "[struct]";
    break;
  case 6:
    local_8 = "int";
    break;
  case 7:
    local_8 = "float";
    break;
  case 8:
    local_8 = "string";
    break;
  case 9:
    local_8 = "object";
    break;
  case 10:
    local_8 = "vector";
    break;
  default:
    if ((in_ESI < 0x10) || (0x1f < in_ESI)) {
      if (in_ESI < 0x20) {
        local_8 = "[invalid type]";
      }
      else {
        pNVar1 = GetStructSymbol(in_stack_ffffffffffffffe0,NscType_Unknown);
        if (pNVar1 == (NscSymbol *)0x0) {
          __assert_fail("pSymbol != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscContext.cpp"
                        ,0xf82,"const char *CNscContext::GetTypeName(NscType)");
        }
        local_8 = pNVar1->szString;
      }
    }
    else {
      GetCompilerState((CNscContext *)0x1eb012);
      local_8 = (char *)std::__cxx11::string::c_str();
    }
  }
  return local_8;
}

Assistant:

const char *CNscContext::GetTypeName (NscType nType)
{

	//
	// Switch based on the type
	//

	switch (nType)
	{
		case NscType_Unknown:
			return "[unknown]";
		case NscType_Void:
			return "void";
		case NscType_Error:
			return "[error]";
		case NscType_Action:
			return "action";
		case NscType_Statement:
			return "[statement]";
		case NscType_Struct:
			return "[struct]";
		case NscType_Integer:
			return "int";
		case NscType_Float:
			return "float";
		case NscType_String:
			return "string";
		case NscType_Object:
			return "object";
		case NscType_Vector:
			return "vector";

		//
		// Default case catches all the other types
		//

		default:

			//
			// If this is an engine type
			//

			if (nType >= NscType_Engine_0 &&
				nType < NscType_Struct_0)
			{
				return GetCompilerState () ->m_astrNscEngineTypes [nType - NscType_Engine_0] .c_str ();
			}

			//
			// If we have a structure
			//

			else if (nType >= NscType_Struct_0)
			{

				//
				// Loop through the values in the structure
				// and add them as variables.
				//

				NscSymbol *pSymbol = GetStructSymbol (nType);
				assert (pSymbol != NULL);
				return pSymbol ->szString;
			}

			//
			// Otherwise, error.  Unknown type
			//

			else
			{
				return "[invalid type]";
			}
	}
}